

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

Precision *
icu_63::number::impl::stem_to_object::precision(Precision *__return_storage_ptr__,StemEnum stem)

{
  undefined8 local_90;
  FractionSignificantSettings local_88;
  undefined8 local_80;
  undefined8 local_78;
  Precision local_70;
  Precision local_50;
  undefined8 local_30;
  FractionSignificantSettings local_28;
  undefined8 local_20;
  undefined8 local_18;
  StemEnum local_c;
  StemEnum stem_local;
  
  local_c = stem;
  switch(stem) {
  case STEM_PRECISION_INTEGER:
    Precision::integer();
    *(undefined8 *)__return_storage_ptr__ = local_30;
    (__return_storage_ptr__->fUnion).fracSig = local_28;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_20;
    *(undefined8 *)&__return_storage_ptr__->fRoundingMode = local_18;
    break;
  case STEM_PRECISION_UNLIMITED:
    Precision::unlimited();
    break;
  case STEM_PRECISION_CURRENCY_STANDARD:
    Precision::currency((CurrencyPrecision *)&local_50,UCURR_USAGE_STANDARD);
    __return_storage_ptr__->fType = local_50.fType;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_50._4_4_;
    (__return_storage_ptr__->fUnion).fracSig = local_50.fUnion.fracSig;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_50.fUnion._8_8_;
    __return_storage_ptr__->fRoundingMode = local_50.fRoundingMode;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_50._28_4_;
    break;
  case STEM_PRECISION_CURRENCY_CASH:
    Precision::currency((CurrencyPrecision *)&local_70,UCURR_USAGE_CASH);
    __return_storage_ptr__->fType = local_70.fType;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_70._4_4_;
    (__return_storage_ptr__->fUnion).fracSig = local_70.fUnion.fracSig;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_70.fUnion._8_8_;
    __return_storage_ptr__->fRoundingMode = local_70.fRoundingMode;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_70._28_4_;
    break;
  default:
    Precision::integer();
    *(undefined8 *)__return_storage_ptr__ = local_90;
    (__return_storage_ptr__->fUnion).fracSig = local_88;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) = local_80;
    *(undefined8 *)&__return_storage_ptr__->fRoundingMode = local_78;
  }
  return __return_storage_ptr__;
}

Assistant:

Precision stem_to_object::precision(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_PRECISION_INTEGER:
            return Precision::integer();
        case STEM_PRECISION_UNLIMITED:
            return Precision::unlimited();
        case STEM_PRECISION_CURRENCY_STANDARD:
            return Precision::currency(UCURR_USAGE_STANDARD);
        case STEM_PRECISION_CURRENCY_CASH:
            return Precision::currency(UCURR_USAGE_CASH);
        default:
            U_ASSERT(false);
            return Precision::integer(); // return a value: silence compiler warning
    }
}